

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmScriptGenerator::GenerateScriptActionsOnce(cmScriptGenerator *this,ostream *os,Indent *indent)

{
  bool bVar1;
  ostream *poVar2;
  int local_50 [4];
  undefined1 local_40 [8];
  string config_test;
  Indent *indent_local;
  ostream *os_local;
  cmScriptGenerator *this_local;
  
  config_test.field_2._8_8_ = indent;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Configurations);
  if (bVar1) {
    (*this->_vptr_cmScriptGenerator[4])(this,os,config_test.field_2._8_8_);
  }
  else {
    CreateConfigTest((string *)local_40,this,&this->Configurations);
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent *)config_test.field_2._8_8_);
    poVar2 = std::operator<<(poVar2,"if(");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::operator<<(poVar2,")\n");
    local_50[0] = (int)cmScriptGeneratorIndent::Next
                                 ((cmScriptGeneratorIndent *)config_test.field_2._8_8_,2);
    (*this->_vptr_cmScriptGenerator[4])(this,os,local_50);
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent *)config_test.field_2._8_8_);
    poVar2 = std::operator<<(poVar2,"endif(");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsOnce(std::ostream& os,
                                                  Indent const& indent)
{
  if(this->Configurations.empty())
    {
    // This rule is for all configurations.
    this->GenerateScriptActions(os, indent);
    }
  else
    {
    // Generate a per-configuration block.
    std::string config_test = this->CreateConfigTest(this->Configurations);
    os << indent << "if(" << config_test << ")\n";
    this->GenerateScriptActions(os, indent.Next());
    os << indent << "endif(" << config_test << ")\n";
    }
}